

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakelibraryinfo.cpp
# Opt level: O0

void QMakeLibraryInfo::sysrootify(QString *path)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  qsizetype qVar4;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString sysroot;
  QString *in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff81;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffff84;
  QLatin1Char local_69 [3];
  char16_t local_66;
  QLatin1Char local_63 [3];
  char16_t local_60;
  QLatin1Char local_5d [3];
  char16_t local_5a;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  rawLocation(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
  QVariant::fromValue<QString,_true>(in_RDI);
  bVar2 = QVariant::toBool();
  bVar2 = bVar2 ^ 0xff;
  QVariant::~QVariant((QVariant *)&stack0xffffffffffffffd8);
  QString::~QString((QString *)0x1223f5);
  if ((bVar2 & 1) == 0) {
    local_58 = 0xaaaaaaaaaaaaaaaa;
    local_50 = 0xaaaaaaaaaaaaaaaa;
    local_48 = 0xaaaaaaaaaaaaaaaa;
    rawLocation(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
    bVar3 = QString::isEmpty((QString *)0x122443);
    if (!bVar3) {
      qVar4 = QString::size(in_RDI);
      uVar5 = false;
      if (2 < qVar4) {
        local_5a = (char16_t)
                   QString::at(in_RDI,CONCAT44(in_stack_ffffffffffffff84,
                                               CONCAT13(bVar2,(uint3)CONCAT11(
                                                  in_stack_ffffffffffffff81,
                                                  in_stack_ffffffffffffff80))));
        QLatin1Char::QLatin1Char(local_5d,':');
        QChar::QChar<QLatin1Char,_true>
                  ((QChar *)CONCAT44(in_stack_ffffffffffffff84,
                                     CONCAT13(bVar2,CONCAT12(uVar5,CONCAT11(
                                                  in_stack_ffffffffffffff81,
                                                  in_stack_ffffffffffffff80)))),
                   (QLatin1Char)(char)((ulong)in_RDI >> 0x38));
        bVar3 = operator==((QChar *)CONCAT44(in_stack_ffffffffffffff84,
                                             CONCAT13(bVar2,CONCAT12(uVar5,CONCAT11(
                                                  in_stack_ffffffffffffff81,
                                                  in_stack_ffffffffffffff80)))),
                           (QChar *)in_stack_ffffffffffffff78);
        uVar6 = false;
        uVar5 = uVar6;
        if (bVar3) {
          local_60 = (char16_t)
                     QString::at(in_RDI,CONCAT44(in_stack_ffffffffffffff84,
                                                 CONCAT13(bVar2,(uint3)CONCAT11(
                                                  in_stack_ffffffffffffff81,
                                                  in_stack_ffffffffffffff80))));
          QLatin1Char::QLatin1Char(local_63,'/');
          QChar::QChar<QLatin1Char,_true>
                    ((QChar *)CONCAT44(in_stack_ffffffffffffff84,
                                       CONCAT13(bVar2,CONCAT12(uVar6,CONCAT11(
                                                  in_stack_ffffffffffffff81,
                                                  in_stack_ffffffffffffff80)))),
                     (QLatin1Char)(char)((ulong)in_RDI >> 0x38));
          bVar3 = operator==((QChar *)CONCAT44(in_stack_ffffffffffffff84,
                                               CONCAT13(bVar2,CONCAT12(uVar6,CONCAT11(
                                                  in_stack_ffffffffffffff81,
                                                  in_stack_ffffffffffffff80)))),
                             (QChar *)in_stack_ffffffffffffff78);
          in_stack_ffffffffffffff81 = true;
          uVar5 = in_stack_ffffffffffffff81;
          if (!bVar3) {
            local_66 = (char16_t)
                       QString::at(in_RDI,CONCAT44(in_stack_ffffffffffffff84,
                                                   CONCAT13(bVar2,CONCAT12(uVar6,CONCAT11(1,
                                                  in_stack_ffffffffffffff80)))));
            QLatin1Char::QLatin1Char(local_69,'\\');
            QChar::QChar<QLatin1Char,_true>
                      ((QChar *)CONCAT44(in_stack_ffffffffffffff84,
                                         CONCAT13(bVar2,CONCAT12(uVar6,CONCAT11(
                                                  in_stack_ffffffffffffff81,
                                                  in_stack_ffffffffffffff80)))),
                       (QLatin1Char)(char)((ulong)in_RDI >> 0x38));
            in_stack_ffffffffffffff81 =
                 operator==((QChar *)CONCAT44(in_stack_ffffffffffffff84,
                                              CONCAT13(bVar2,CONCAT12(uVar6,CONCAT11(
                                                  in_stack_ffffffffffffff81,
                                                  in_stack_ffffffffffffff80)))),
                            (QChar *)in_stack_ffffffffffffff78);
            uVar5 = in_stack_ffffffffffffff81;
          }
        }
      }
      if ((bool)uVar5 == false) {
        QString::prepend((QString *)
                         CONCAT44(in_stack_ffffffffffffff84,
                                  CONCAT13(bVar2,(uint3)CONCAT11(in_stack_ffffffffffffff81,
                                                                 in_stack_ffffffffffffff80))),
                         in_stack_ffffffffffffff78);
      }
      else {
        QString::replace((longlong)in_RDI,0,(QString *)0x2);
      }
    }
    QString::~QString((QString *)0x1225a6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMakeLibraryInfo::sysrootify(QString &path)
{
    // Acceptable values for SysrootifyPrefixPath are "true" and "false"
    if (!QVariant::fromValue(rawLocation(SysrootifyPrefixPath, FinalPaths)).toBool())
        return;

    const QString sysroot = rawLocation(SysrootPath, FinalPaths);
    if (sysroot.isEmpty())
        return;

    if (path.size() > 2 && path.at(1) == QLatin1Char(':')
        && (path.at(2) == QLatin1Char('/') || path.at(2) == QLatin1Char('\\'))) {
        path.replace(0, 2, sysroot); // Strip out the drive on Windows targets
    } else {
        path.prepend(sysroot);
    }
}